

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O2

int64_t __thiscall
disruptor::BusySpinStrategy::WaitFor<long,std::ratio<1l,1l>>
          (BusySpinStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1L>_> *timeout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  code *pcVar5;
  code *pcVar6;
  bool bVar7;
  function<long_()> min_sequence;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar1 = timeout->__r;
  bVar7 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  if (bVar7) {
    cursor = (Sequence *)dependents;
  }
  pcVar5 = std::
           _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
           ::_M_invoke;
  if (!bVar7) {
    pcVar5 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
             ::_M_invoke;
  }
  pcVar6 = std::
           _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
           ::_M_manager;
  if (!bVar7) {
    pcVar6 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
             ::_M_manager;
  }
  min_sequence.super__Function_base._M_functor._8_8_ = 0;
  min_sequence.super__Function_base._M_functor._M_unused._M_object = cursor;
  min_sequence.super__Function_base._M_manager = pcVar6;
  min_sequence._M_invoker = pcVar5;
  do {
    lVar3 = std::function<long_()>::operator()(&min_sequence);
    if (*sequence <= lVar3) break;
    if (((alerted->_M_base)._M_i & 1U) != 0) {
      lVar3 = -2;
      break;
    }
    lVar4 = std::chrono::_V2::system_clock::now();
    lVar3 = -3;
  } while (lVar4 < lVar1 * 1000000000 + lVar2);
  std::_Function_base::~_Function_base(&min_sequence.super__Function_base);
  return lVar3;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;

      SpinPause();
    }

    return available_sequence;
  }